

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

PartitionGlobalMergeStates * __thiscall
duckdb::AsOfGlobalSourceState::GetMergeStates(AsOfGlobalSourceState *this)

{
  _Head_base<0UL,_duckdb::PartitionGlobalMergeStates_*,_false> __p;
  type args;
  type pPVar1;
  _Head_base<0UL,_duckdb::PartitionGlobalMergeStates_*,_false> local_20;
  
  ::std::mutex::lock(&this->lock);
  if ((this->merge_states).
      super_unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeStates_*,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalMergeStates_*,_false>._M_head_impl ==
      (PartitionGlobalMergeStates *)0x0) {
    args = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
           ::operator*(&this->gsink->lhs_sink);
    make_uniq<duckdb::PartitionGlobalMergeStates,duckdb::PartitionGlobalSinkState&>
              ((duckdb *)&local_20,args);
    __p._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
    ::reset((__uniq_ptr_impl<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
             *)&this->merge_states,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
    ::~unique_ptr((unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>_>
                   *)&local_20);
  }
  pPVar1 = unique_ptr<duckdb::PartitionGlobalMergeStates,_std::default_delete<duckdb::PartitionGlobalMergeStates>,_true>
           ::operator*(&this->merge_states);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return pPVar1;
}

Assistant:

PartitionGlobalMergeStates &GetMergeStates() {
		lock_guard<mutex> guard(lock);
		if (!merge_states) {
			merge_states = make_uniq<PartitionGlobalMergeStates>(*gsink.lhs_sink);
		}
		return *merge_states;
	}